

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O3

void density_tests::detail::
     PutTestObject<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>,_128UL,_8UL>
     ::consume(consume_operation *i_consume)

{
  runtime_type<> *prVar1;
  uchar *storage;
  size_t i;
  long lVar2;
  
  prVar1 = density::
           heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
           consume_operation::complete_type((consume_operation *)i_consume);
  if (prVar1->m_feature_table !=
      (tuple_type *)
      density::detail::
      FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::TestObject<128ul,8ul>>
      ::s_table) {
    assert_failed<>("i_consume.complete_type().template is<ElementType>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0x14f);
  }
  density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>::
  consume_operation::element<density_tests::TestObject<128ul,8ul>>((consume_operation *)i_consume);
  lVar2 = 0;
  do {
    assert_failed<>("storage[i] == s_fill_byte",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/test_objects.h"
                    ,0x89);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x80);
  return;
}

Assistant:

static void consume(const typename QUEUE::consume_operation & i_consume)
            {
                DENSITY_TEST_ASSERT(i_consume.complete_type().template is<ElementType>());
                i_consume.template element<ElementType>().check();
            }